

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fsm.h
# Opt level: O1

void __thiscall FsmTable::~FsmTable(FsmTable *this)

{
  pointer ppFVar1;
  FsmState *pFVar2;
  pointer piVar3;
  FsmState **pfstate;
  pointer ppFVar4;
  
  ppFVar1 = (this->m_vpfstate).super__Vector_base<FsmState_*,_std::allocator<FsmState_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppFVar4 = (this->m_vpfstate).super__Vector_base<FsmState_*,_std::allocator<FsmState_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppFVar4 != ppFVar1; ppFVar4 = ppFVar4 + 1
      ) {
    pFVar2 = *ppFVar4;
    if (pFVar2 != (FsmState *)0x0) {
      piVar3 = (pFVar2->m_vgiCells).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (piVar3 != (pointer)0x0) {
        operator_delete(piVar3,(long)(pFVar2->m_vgiCells).
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage - (long)piVar3);
      }
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&(pFVar2->m_setiruleSuccess)._M_t);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&(pFVar2->m_setiruleMatched)._M_t);
      operator_delete(pFVar2,0x90);
    }
  }
  ppFVar4 = (this->m_vpfstate).super__Vector_base<FsmState_*,_std::allocator<FsmState_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppFVar4 != (pointer)0x0) {
    operator_delete(ppFVar4,(long)(this->m_vpfstate).
                                  super__Vector_base<FsmState_*,_std::allocator<FsmState_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppFVar4)
    ;
    return;
  }
  return;
}

Assistant:

~FsmTable()
	{
		for (auto && pfstate: m_vpfstate)
			delete pfstate;
	}